

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O0

void __thiscall
kratos::Simulator::set_complex_value_
          (Simulator *this,Var *var,
          optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *op_value)

{
  unsigned_long uVar1;
  value_type vVar2;
  byte bVar3;
  initializer_list<unsigned_long_*> __l;
  Var *__n;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *var_00;
  bool bVar4;
  VarType VVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  size_type sVar10;
  const_reference pvVar11;
  UserException *pUVar12;
  reference pvVar13;
  InternalException *pIVar14;
  mapped_type *pmVar15;
  reference puVar16;
  size_type sVar17;
  ulong uVar18;
  reference ppuVar19;
  pair<std::__detail::_Node_iterator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false,_false>,_bool>
  pVar20;
  optional<unsigned_long> op_value_00;
  uint local_304;
  uint local_300;
  uint local_2fc;
  uint32_t bit;
  uint32_t bit_mask;
  uint32_t i_4;
  uint32_t var_width;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  changed_bits;
  string local_2b0;
  uint32_t local_28c;
  ulong uStack_288;
  uint32_t w;
  uint64_t i_3;
  undefined1 local_278 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v_;
  value_type v_1;
  string local_250;
  reference local_230;
  Var *local_228;
  uint64_t i_2;
  mapped_type *v_ref_1;
  undefined1 local_210;
  Var *local_208;
  uint64_t i_1;
  undefined1 local_1f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_1d8;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_1d0;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
  local_1c8;
  byte local_1bd;
  uint local_1bc;
  bool fill_in;
  const_iterator cStack_1b8;
  uint32_t s_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  Var *local_198;
  uint64_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *v_ref;
  const_iterator cStack_180;
  uint32_t s;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> **local_160;
  undefined8 local_158;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false> local_150;
  _Node_iterator_base<std::pair<const_kratos::Var_*const,_unsigned_long>,_false> local_148;
  undefined1 local_13a;
  allocator<char> local_139;
  string local_138;
  type_conflict1 *local_118;
  type *var_low;
  type *var_high;
  undefined1 local_fa;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  index;
  Var *root;
  uint32_t high;
  uint32_t low;
  Var *fill_var;
  uint64_t base;
  vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> values;
  undefined1 local_80 [12];
  undefined1 local_6a;
  allocator<char> local_69;
  string local_68;
  undefined1 local_38 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> value;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *op_value_local;
  Var *var_local;
  Simulator *this_local;
  
  value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)op_value;
  op_value_local = (optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)var;
  var_local = (Var *)this;
  bVar4 = std::optional::operator_cast_to_bool((optional *)op_value);
  if (!bVar4) {
    return;
  }
  __x = std::optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::operator*
                  ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
                   value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,__x);
  pvVar9 = Var::size((Var *)op_value_local);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar9);
  if (sVar10 == 1) {
    pvVar9 = Var::size((Var *)op_value_local);
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar9);
    if (*pvVar11 == 1) {
      sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
      var_00 = op_value_local;
      if (1 < sVar10) {
        local_6a = 1;
        pUVar12 = (UserException *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"Cannot set multiple values to a scalar",&local_69);
        UserException::UserException(pUVar12,&local_68);
        local_6a = 0;
        __cxa_throw(pUVar12,&UserException::typeinfo,UserException::~UserException);
      }
      pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,0);
      std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                ((optional<unsigned_long> *)local_80,pvVar13);
      op_value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._12_4_ = 0;
      op_value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           (_Storage<unsigned_long,_true>)local_80._0_8_;
      op_value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_80[8];
      op_value_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._9_3_ = local_80._9_3_;
      set_value_(this,(Var *)var_00,op_value_00);
      values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      goto LAB_003812f1;
    }
  }
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::vector
            ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&base);
  fill_var = (Var *)0x1;
  VVar5 = Var::type((Var *)op_value_local);
  if (VVar5 == Slice) {
    index.
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(**(code **)(*(long *)&(op_value_local->
                                         super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                         )._M_payload.
                                         super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         ._M_payload._M_value.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl + 0x140))();
    _high = (Var *)index.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    get_slice_index((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)local_d8,this,(Var *)op_value_local);
    bVar4 = std::
            vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            ::empty((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)local_d8);
    if (bVar4) {
      local_fa = 1;
      pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Empty slice",&local_f9);
      InternalException::InternalException(pIVar14,&local_f8);
      local_fa = 0;
      __cxa_throw(pIVar14,&InternalException::typeinfo,InternalException::~InternalException);
    }
    register0x00000000 =
         compute_var_high_low
                   ((Var *)index.
                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)local_d8);
    var_low = std::get<0ul,unsigned_int,unsigned_int>
                        ((pair<unsigned_int,_unsigned_int> *)((long)&var_high + 4));
    local_118 = std::get<1ul,unsigned_int,unsigned_int>
                          ((pair<unsigned_int,_unsigned_int> *)((long)&var_high + 4));
    uVar8 = *local_118;
    uVar6 = Var::var_width((Var *)index.
                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (uVar8 % uVar6 != 0) {
LAB_0038062a:
      local_13a = 1;
      pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"Misaligned vector slicing",&local_139);
      InternalException::InternalException(pIVar14,&local_138);
      local_13a = 0;
      __cxa_throw(pIVar14,&InternalException::typeinfo,InternalException::~InternalException);
    }
    uVar8 = *var_low;
    uVar6 = Var::var_width((Var *)index.
                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    uVar7 = Var::var_width((Var *)index.
                                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (uVar8 % uVar6 != uVar7 - 1) goto LAB_0038062a;
    root._4_4_ = *local_118;
    root._0_4_ = *var_low;
    pvVar9 = Var::size((Var *)index.
                              super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar9);
    if (sVar10 == 1) {
      pvVar9 = Var::size((Var *)index.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(pvVar9);
      if (*pvVar11 != 1) goto LAB_00380860;
      local_148._M_cur =
           (__node_type *)
           std::
           unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
           ::find(&this->values_,
                  (key_type *)
                  &index.
                   super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_150._M_cur =
           (__node_type *)
           std::
           unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
           ::end(&this->values_);
      bVar4 = std::__detail::operator==(&local_148,&local_150);
      if (bVar4) {
        pmVar15 = std::
                  unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
                  ::operator[](&this->values_,
                               (key_type *)
                               &index.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        *pmVar15 = 0;
      }
      __range3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 std::
                 unordered_map<const_kratos::Var_*,_unsigned_long,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_unsigned_long>_>_>
                 ::at(&this->values_,
                      (key_type *)
                      &index.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_160 = &__range3;
      local_158 = 1;
      __l._M_len = 1;
      __l._M_array = (iterator)local_160;
      std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::operator=
                ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&base,__l);
    }
    else {
LAB_00380860:
      pvVar9 = Var::size((Var *)index.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar9);
      cStack_180 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar9);
      while (bVar4 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffe80), bVar4) {
        puVar16 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&__end3);
        v_ref._4_4_ = *puVar16;
        fill_var = (Var *)((ulong)v_ref._4_4_ * (long)fill_var);
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end3);
      }
      i = (uint64_t)
          std::
          unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::at(&this->complex_values_,
               (key_type *)
               &index.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::reserve
                ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&base,
                 (size_type)fill_var);
      for (local_198 = (Var *)0x0; local_198 < fill_var;
          local_198 = (Var *)((long)&(local_198->super_IRNode)._vptr_IRNode + 1)) {
        __range2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)i,
                              (size_type)local_198);
        std::vector<unsigned_long*,std::allocator<unsigned_long*>>::emplace_back<unsigned_long*>
                  ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)&base,
                   (unsigned_long **)&__range2);
      }
    }
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)local_d8);
  }
  else {
    pvVar9 = Var::size((Var *)op_value_local);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar9);
    cStack_1b8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar9);
    while (bVar4 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffe48), bVar4) {
      puVar16 = __gnu_cxx::
                __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator*(&__end2);
      local_1bc = *puVar16;
      fill_var = (Var *)((ulong)local_1bc * (long)fill_var);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
    _high = (Var *)op_value_local;
    root._4_4_ = 0;
    root._0_4_ = (int)fill_var - 1;
  }
  local_1bd = 0;
  local_1c8._M_cur =
       (__node_type *)
       std::
       unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
       ::find(&this->complex_values_,(key_type *)&high);
  local_1d0._M_cur =
       (__node_type *)
       std::
       unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
       ::end(&this->complex_values_);
  bVar4 = std::__detail::operator==(&local_1c8,&local_1d0);
  if (bVar4) {
    local_1bd = 1;
    local_1d8._M_cur =
         (__node_type *)
         std::
         unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
         ::find(&this->complex_values_,(key_type *)&high);
    v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  ::end(&this->complex_values_);
    bVar4 = std::__detail::operator==
                      (&local_1d8,
                       (_Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                        *)&v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    __n = fill_var;
    if (bVar4) {
      std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i_1 + 7));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f8,(size_type)__n,
                 (allocator<unsigned_long> *)((long)&i_1 + 7));
      std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i_1 + 7));
      for (local_208 = (Var *)0x0; local_208 < fill_var;
          local_208 = (Var *)((long)&(local_208->super_IRNode)._vptr_IRNode + 1)) {
        pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f8,
                             (size_type)local_208);
        *pvVar13 = 0;
      }
      pVar20 = std::
               unordered_map<kratos::Var_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
               ::
               emplace<kratos::Var_const*&,std::vector<unsigned_long,std::allocator<unsigned_long>>&>
                         ((unordered_map<kratos::Var_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::hash<kratos::Var_const*>,std::equal_to<kratos::Var_const*>,std::allocator<std::pair<kratos::Var_const*const,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                           *)&this->complex_values_,(Var **)&op_value_local,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f8);
      v_ref_1 = (mapped_type *)
                pVar20.first.
                super__Node_iterator_base<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_false>
                ._M_cur;
      local_210 = pVar20.second;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1f8);
    }
  }
  VVar5 = Var::type((Var *)op_value_local);
  if (VVar5 != Slice) {
    std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::reserve
              ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&base,
               (size_type)fill_var);
    i_2 = (uint64_t)
          std::
          unordered_map<const_kratos::Var_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::at(&this->complex_values_,(key_type *)&op_value_local);
    for (local_228 = (Var *)0x0; local_228 < fill_var;
        local_228 = (Var *)((long)&(local_228->super_IRNode)._vptr_IRNode + 1)) {
      local_230 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)i_2,
                             (size_type)local_228);
      std::vector<unsigned_long*,std::allocator<unsigned_long*>>::emplace_back<unsigned_long*>
                ((vector<unsigned_long*,std::allocator<unsigned_long*>> *)&base,&local_230);
    }
  }
  sVar10 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::size
                     ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&base);
  sVar17 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  if (sVar10 != sVar17) {
    uVar8 = (*(_high->super_IRNode)._vptr_IRNode[0x18])();
    if ((uVar8 & 1) == 0) {
      changed_bits._M_h._M_single_bucket._6_1_ = 1;
      pUVar12 = (UserException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"Misaligned slicing",
                 (allocator<char> *)((long)&changed_bits._M_h._M_single_bucket + 7));
      UserException::UserException(pUVar12,&local_2b0);
      changed_bits._M_h._M_single_bucket._6_1_ = 0;
      __cxa_throw(pUVar12,&UserException::typeinfo,UserException::~UserException);
    }
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
    if (1 < sVar10) {
      v_1._6_1_ = 1;
      pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"Multiple value assigned to packed array not supported",
                 (allocator<char> *)((long)&v_1 + 7));
      InternalException::InternalException(pIVar14,&local_250);
      v_1._6_1_ = 0;
      __cxa_throw(pIVar14,&InternalException::typeinfo,InternalException::~InternalException);
    }
    pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,0);
    v_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*pvVar13;
    sVar10 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::size
                       ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&base);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i_3 + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278,sVar10,
               (allocator<unsigned_long> *)((long)&i_3 + 7));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i_3 + 7));
    for (uStack_288 = 0; uVar18 = uStack_288,
        sVar10 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::size
                           ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&base),
        uVar18 < sVar10; uStack_288 = uStack_288 + 1) {
      local_28c = Var::var_width(_high);
      bVar3 = (byte)local_28c;
      uVar18 = (ulong)v_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage >> (bVar3 * (char)uStack_288 & 0x3f)
      ;
      pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278,
                           uStack_288);
      *pvVar13 = uVar18 & (-1L << (bVar3 & 0x3f) ^ 0xffffffffffffffffU);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_278);
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&i_4);
  bit_mask = Var::var_width(_high);
  for (bit = root._4_4_; bit <= (type)root; bit = bit + 1) {
    ppuVar19 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::operator[]
                         ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&base,
                          (ulong)bit);
    uVar1 = **ppuVar19;
    pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                         (ulong)bit);
    if ((uVar1 != *pvVar13) || ((local_1bd & 1) != 0)) {
      ppuVar19 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::operator[]
                           ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&base,
                            (ulong)bit);
      uVar1 = **ppuVar19;
      pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                           (ulong)bit);
      local_2fc = (uint)uVar1 ^ (uint)*pvVar13;
      pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,
                           (ulong)bit);
      vVar2 = *pvVar13;
      ppuVar19 = std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::operator[]
                           ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&base,
                            (ulong)bit);
      **ppuVar19 = vVar2;
      for (local_300 = 0; local_300 < bit_mask; local_300 = local_300 + 1) {
        if (((local_2fc >> ((byte)local_300 & 0x1f) & 1) != 0) || ((local_1bd & 1) != 0)) {
          local_304 = local_300 + bit_mask * bit;
          std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::emplace<unsigned_int>
                    ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&i_4,&local_304);
        }
      }
    }
  }
  trigger_event(this,_high,
                (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&i_4);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&i_4);
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::~vector
            ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)&base);
  values.super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
LAB_003812f1:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  return;
}

Assistant:

void Simulator::set_complex_value_(const kratos::Var *var,
                                   const std::optional<std::vector<uint64_t>> &op_value) {
    if (!op_value) return;
    auto value = *op_value;
    if (var->size().size() == 1 && var->size().front() == 1) {
        if (value.size() > 1) throw UserException("Cannot set multiple values to a scalar");
        set_value_(var, value[0]);
        return;
    }
    std::vector<uint64_t *> values;
    uint64_t base = 1;
    const Var *fill_var;
    uint32_t low, high;
    if (var->type() == VarType::Slice) {
        const auto *root = var->get_var_root_parent();
        fill_var = root;
        auto index = get_slice_index(var);
        if (index.empty()) throw InternalException("Empty slice");
        auto const [var_high, var_low] = compute_var_high_low(root, index);
        if (var_low % root->var_width() != 0 ||
            (var_high % root->var_width() != root->var_width() - 1))
            throw InternalException("Misaligned vector slicing");
        low = var_low;
        high = var_high;
        if (root->size().size() == 1 && root->size().front() == 1) {
            // this is size one
            if (values_.find(root) == values_.end()) values_[root] = 0;
            values = {&values_.at(root)};
        } else {
            for (uint32_t s : root->size()) {
                base *= s;
            }
            std::vector<uint64_t> &v_ref = complex_values_.at(root);
            values.reserve(base);
            for (uint64_t i = 0; i < base; i++) values.emplace_back(&v_ref[i]);
        }
    } else {
        for (uint32_t s : var->size()) {
            base *= s;
        }
        fill_var = var;
        low = 0;
        high = base - 1;
    }
    bool fill_in = false;
    if (complex_values_.find(fill_var) == complex_values_.end()) {
        // whatever bits changed
        // fill in values
        fill_in = true;
        if (complex_values_.find(fill_var) == complex_values_.end()) {
            // fill in values
            std::vector<uint64_t> v(base);
            for (uint64_t i = 0; i < base; i++) v[i] = 0;
            complex_values_.emplace(var, v);
        }
    }

    // get values
    if (var->type() != VarType::Slice) {
        values.reserve(base);
        auto &v_ref = complex_values_.at(var);
        for (uint64_t i = 0; i < base; i++) values.emplace_back(&v_ref[i]);
    }

    if (values.size() != value.size()) {
        // expand the value to if the target is packed
        if (fill_var->is_packed()) {
            if (value.size() > 1) {
                throw InternalException("Multiple value assigned to packed array not supported");
            }
            auto v = value[0];
            std::vector<uint64_t> v_(values.size());
            for (uint64_t i = 0; i < values.size(); i++) {
                auto w = fill_var->var_width();
                v_[i] = (v >> (w * i)) & (~(UINT64_MASK << w));
            }
            value = v_;
        } else {
            throw UserException("Misaligned slicing");
        }
    }
    std::unordered_set<uint32_t> changed_bits;
    uint32_t var_width = fill_var->var_width();

    for (uint32_t i = low; i <= high; i++) {
        if (*(values[i]) != value[i] || fill_in) {
            uint32_t bit_mask = (*values[i]) ^ value[i];
            *(values[i]) = value[i];
            for (uint32_t bit = 0; bit < var_width; bit++) {
                if ((bit_mask >> bit) & 1u || fill_in) {
                    changed_bits.emplace(bit + var_width * i);
                }
            }
        }
    }
    trigger_event(fill_var, changed_bits);
}